

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O0

void aes_cbc_sw_decrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  uint8_t *vout;
  undefined8 *puVar1;
  uint8_t *local_a0;
  uint8_t *output;
  uint8_t *decrypted;
  size_t i;
  size_t blocks;
  uint8_t data [64];
  size_t blocks_remaining;
  uint8_t *blk;
  aes_sw_context *ctx;
  int blklen_local;
  void *vblk_local;
  ssh_cipher *ciph_local;
  
  data._56_8_ = SEXT48(blklen / 0x10);
  memset(&blocks,0,0x40);
  blocks_remaining = (size_t)vblk;
  for (; data._56_8_ != 0; data._56_8_ = data._56_8_ - (long)local_a0) {
    if ((ulong)data._56_8_ < 4) {
      local_a0 = (uint8_t *)data._56_8_;
    }
    else {
      local_a0 = (uint8_t *)0x4;
    }
    memcpy(&blocks,(void *)blocks_remaining,(long)local_a0 << 4);
    aes_sliced_d_parallel((uint8_t *)&blocks,(uint8_t *)&blocks,(aes_sliced_key *)(ciph + -0xa2));
    for (decrypted = (uint8_t *)0x0; decrypted < local_a0; decrypted = decrypted + 1) {
      vout = data + (long)decrypted * 0x10 + -8;
      puVar1 = (undefined8 *)(blocks_remaining + (long)decrypted * 0x10);
      memxor16(vout,vout,ciph + -0xb);
      ciph[-0xb].vt = (ssh_cipheralg *)*puVar1;
      ciph[-10].vt = (ssh_cipheralg *)puVar1[1];
      *puVar1 = *(undefined8 *)vout;
      puVar1[1] = *(undefined8 *)(data + (long)decrypted * 0x10);
    }
    blocks_remaining = (long)local_a0 * 0x10 + blocks_remaining;
  }
  smemclr(&blocks,0x40);
  return;
}

Assistant:

static inline void aes_cbc_sw_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    uint8_t *blk = (uint8_t *)vblk;

    /*
     * CBC decryption can run in parallel, because all the
     * _ciphertext_ blocks are already available.
     */

    size_t blocks_remaining = blklen / 16;

    uint8_t data[SLICE_PARALLELISM * 16];
    /* Zeroing the data array is probably overcautious, but it avoids
     * technically undefined behaviour from leaving it uninitialised
     * if our very first iteration doesn't include enough cipher
     * blocks to populate it fully */
    memset(data, 0, sizeof(data));

    while (blocks_remaining > 0) {
        /* Number of blocks we'll handle in this iteration. If we're
         * dealing with fewer than the maximum, it doesn't matter -
         * it's harmless to run the full parallel cipher function
         * anyway. */
        size_t blocks = (blocks_remaining < SLICE_PARALLELISM ?
                         blocks_remaining : SLICE_PARALLELISM);

        /* Parallel-decrypt the input, in a separate array so we still
         * have the cipher stream available for XORing. */
        memcpy(data, blk, 16 * blocks);
        aes_sliced_d_parallel(data, data, &ctx->sk);

        /* Write the output and update the IV */
        for (size_t i = 0; i < blocks; i++) {
            uint8_t *decrypted = data + 16*i;
            uint8_t *output = blk + 16*i;

            memxor16(decrypted, decrypted, ctx->iv.cbc.prevblk);
            memcpy(ctx->iv.cbc.prevblk, output, 16);
            memcpy(output, decrypted, 16);
        }

        /* Advance the input pointer. */
        blk += 16 * blocks;
        blocks_remaining -= blocks;
    }

    smemclr(data, sizeof(data));
}